

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy.cpp
# Opt level: O0

void __thiscall NaDummyFunc::NaDummyFunc(NaDummyFunc *this,char *szOptions,NaVector *vInit)

{
  uint uVar1;
  uint uVar2;
  undefined8 *puVar3;
  long *in_RDX;
  undefined8 in_RSI;
  NaExternFunc *in_RDI;
  int i;
  uint local_28;
  
  NaExternFunc::NaExternFunc(in_RDI);
  *(undefined ***)in_RDI = &PTR_PrintLog_00103d30;
  NaPrintLog("dummy: options=\'%s\'\n",in_RSI);
  NaPrintLog("dummy: initial:");
  local_28 = 0;
  while( true ) {
    uVar1 = (**(code **)(*in_RDX + 0x30))();
    if (uVar1 <= local_28) break;
    puVar3 = (undefined8 *)(**(code **)(*in_RDX + 0x40))(in_RDX,local_28);
    NaPrintLog(" %g",*puVar3);
    local_28 = local_28 + 1;
  }
  NaPrintLog("\n");
  NaUnit::Assign((uint)in_RDI,2,3);
  uVar1 = (**(code **)(*(long *)in_RDI + 0x48))();
  uVar2 = (**(code **)(*(long *)in_RDI + 0x50))();
  NaPrintLog("dummy: dim in=%u out=%u\n",(ulong)uVar1,(ulong)uVar2);
  return;
}

Assistant:

NaDummyFunc::NaDummyFunc (char* szOptions,
			  NaVector& vInit)
{
    NaPrintLog("dummy: options='%s'\n", szOptions);
    NaPrintLog("dummy: initial:");
    for(int i = 0; i < vInit.dim(); ++i) {
	NaPrintLog(" %g", vInit[i]);
    }
    NaPrintLog("\n");

    Assign(2, 3);
    NaPrintLog("dummy: dim in=%u out=%u\n", InputDim(), OutputDim());
}